

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O3

void t2(void)

{
  int iVar1;
  
  puts("PWM dutycycle/range/frequency tests.");
  gpioSetPWMrange(0x19,0xff);
  gpioSetPWMfrequency(0x19,0);
  iVar1 = gpioGetPWMfrequency(0x19);
  CHECK(2,1,iVar1,10,0,"set PWM range, set/get PWM frequency");
  t2_count = 0;
  gpioSetAlertFunc(0x19,t2cb);
  gpioPWM(0x19,0);
  iVar1 = gpioGetPWMdutycycle(0x19);
  CHECK(2,2,iVar1,0,0,"get PWM dutycycle");
  time_sleep(0x3fe0000000000000);
  iVar1 = t2_count;
  time_sleep(0x4000000000000000);
  CHECK(2,3,t2_count - iVar1,0,0,"set PWM dutycycle, callback");
  gpioPWM(0x19,0x80);
  iVar1 = gpioGetPWMdutycycle(0x19);
  CHECK(2,4,iVar1,0x80,0,"get PWM dutycycle");
  iVar1 = t2_count;
  time_sleep(0x4000000000000000);
  CHECK(2,5,t2_count - iVar1,0x28,5,"set PWM dutycycle, callback");
  gpioSetPWMfrequency(0x19,100);
  iVar1 = gpioGetPWMfrequency(0x19);
  CHECK(2,6,iVar1,100,0,"set/get PWM frequency");
  iVar1 = t2_count;
  time_sleep(0x4000000000000000);
  CHECK(2,7,t2_count - iVar1,400,1,"callback");
  gpioSetPWMfrequency(0x19,1000);
  iVar1 = gpioGetPWMfrequency(0x19);
  CHECK(2,8,iVar1,1000,0,"set/get PWM frequency");
  iVar1 = t2_count;
  time_sleep(0x4000000000000000);
  CHECK(2,9,t2_count - iVar1,4000,1,"callback");
  iVar1 = gpioGetPWMrange(0x19);
  CHECK(2,10,iVar1,0xff,0,"get PWM range");
  iVar1 = gpioGetPWMrealRange(0x19);
  CHECK(2,0xb,iVar1,200,0,"get PWM real range");
  gpioSetPWMrange(0x19,2000);
  iVar1 = gpioGetPWMrange(0x19);
  CHECK(2,0xc,iVar1,2000,0,"set/get PWM range");
  iVar1 = gpioGetPWMrealRange(0x19);
  CHECK(2,0xd,iVar1,200,0,"get PWM real range");
  gpioPWM(0x19,0);
  return;
}

Assistant:

void t2()
{
   int dc, f, r, rr, oc;

   printf("PWM dutycycle/range/frequency tests.\n");

   gpioSetPWMrange(GPIO, 255);
   gpioSetPWMfrequency(GPIO, 0);
   f = gpioGetPWMfrequency(GPIO);
   CHECK(2, 1, f, 10, 0, "set PWM range, set/get PWM frequency");

   t2_count=0;

   gpioSetAlertFunc(GPIO, t2cb);

   gpioPWM(GPIO, 0);
   dc = gpioGetPWMdutycycle(GPIO);
   CHECK(2, 2, dc, 0, 0, "get PWM dutycycle");

   time_sleep(0.5); /* allow old notifications to flush */
   oc = t2_count;
   time_sleep(2);
   f = t2_count - oc;
   CHECK(2, 3, f, 0, 0, "set PWM dutycycle, callback");

   gpioPWM(GPIO, 128);
   dc = gpioGetPWMdutycycle(GPIO);
   CHECK(2, 4, dc, 128, 0, "get PWM dutycycle");

   oc = t2_count;
   time_sleep(2);
   f = t2_count - oc;
   CHECK(2, 5, f, 40, 5, "set PWM dutycycle, callback");

   gpioSetPWMfrequency(GPIO, 100);
   f = gpioGetPWMfrequency(GPIO);
   CHECK(2, 6, f, 100, 0, "set/get PWM frequency");

   oc = t2_count;
   time_sleep(2);
   f = t2_count - oc;
   CHECK(2, 7, f, 400, 1, "callback");

   gpioSetPWMfrequency(GPIO, 1000);
   f = gpioGetPWMfrequency(GPIO);
   CHECK(2, 8, f, 1000, 0, "set/get PWM frequency");

   oc = t2_count;
   time_sleep(2);
   f = t2_count - oc;
   CHECK(2, 9, f, 4000, 1, "callback");

   r = gpioGetPWMrange(GPIO);
   CHECK(2, 10, r, 255, 0, "get PWM range");

   rr = gpioGetPWMrealRange(GPIO);
   CHECK(2, 11, rr, 200, 0, "get PWM real range");

   gpioSetPWMrange(GPIO, 2000);
   r = gpioGetPWMrange(GPIO);
   CHECK(2, 12, r, 2000, 0, "set/get PWM range");

   rr = gpioGetPWMrealRange(GPIO);
   CHECK(2, 13, rr, 200, 0, "get PWM real range");

   gpioPWM(GPIO, 0);
}